

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallCommand.cxx
# Opt level: O1

bool __thiscall
cmInstallCommand::MakeFilesFullPath
          (cmInstallCommand *this,char *modeName,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *relFiles,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *absFiles)

{
  pointer pbVar1;
  pointer pcVar2;
  char *pcVar3;
  bool bVar4;
  size_type sVar5;
  size_t sVar6;
  ostream *poVar7;
  pointer pbVar8;
  bool bVar9;
  string file;
  ostringstream e;
  cmInstallCommand *local_1f8;
  string local_1f0;
  char *local_1d0;
  string local_1c8;
  undefined1 local_1a8 [376];
  
  pbVar8 = (relFiles->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (relFiles->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  bVar9 = pbVar8 == pbVar1;
  if (!bVar9) {
    local_1f8 = this;
    local_1d0 = modeName;
    do {
      local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
      pcVar2 = (pbVar8->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1f0,pcVar2,pcVar2 + pbVar8->_M_string_length);
      sVar5 = cmGeneratorExpression::Find(&local_1f0);
      if (sVar5 != 0) {
        bVar4 = cmsys::SystemTools::FileIsFullPath(&local_1f0);
        if (!bVar4) {
          cmMakefile::GetCurrentSourceDirectory_abi_cxx11_((local_1f8->super_cmCommand).Makefile);
          std::__cxx11::string::_M_assign((string *)&local_1f0);
          std::__cxx11::string::append((char *)&local_1f0);
          std::__cxx11::string::_M_append((char *)&local_1f0,(ulong)(pbVar8->_M_dataplus)._M_p);
        }
        if ((sVar5 == 0xffffffffffffffff) &&
           (bVar4 = cmsys::SystemTools::FileIsDirectory(&local_1f0), bVar4)) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          pcVar3 = local_1d0;
          if (local_1d0 == (char *)0x0) {
            std::ios::clear((int)(_func_int *)
                                 ((long)&local_1f8 + (long)*(_func_int **)(local_1a8._0_8_ + -0x18))
                            + 0x50);
          }
          else {
            sVar6 = strlen(local_1d0);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar3,sVar6);
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8," given directory \"",0x12);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1a8,(pbVar8->_M_dataplus)._M_p,
                              pbVar8->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\" to install.",0xd);
          std::__cxx11::stringbuf::str();
          cmCommand::SetError(&local_1f8->super_cmCommand,&local_1c8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
            operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f0._M_dataplus._M_p == &local_1f0.field_2) {
            return bVar9;
          }
          operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
          return bVar9;
        }
      }
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)absFiles,
                 &local_1f0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
        operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
      }
      pbVar8 = pbVar8 + 1;
      bVar9 = pbVar8 == pbVar1;
    } while (!bVar9);
  }
  return bVar9;
}

Assistant:

bool cmInstallCommand::MakeFilesFullPath(
  const char* modeName, const std::vector<std::string>& relFiles,
  std::vector<std::string>& absFiles)
{
  for (std::string const& relFile : relFiles) {
    std::string file = relFile;
    std::string::size_type gpos = cmGeneratorExpression::Find(file);
    if (gpos != 0 && !cmSystemTools::FileIsFullPath(file)) {
      file = this->Makefile->GetCurrentSourceDirectory();
      file += "/";
      file += relFile;
    }

    // Make sure the file is not a directory.
    if (gpos == std::string::npos && cmSystemTools::FileIsDirectory(file)) {
      std::ostringstream e;
      e << modeName << " given directory \"" << relFile << "\" to install.";
      this->SetError(e.str());
      return false;
    }
    // Store the file for installation.
    absFiles.push_back(std::move(file));
  }
  return true;
}